

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall kj::anon_unknown_59::InMemoryDirectory::exists(InMemoryDirectory *this,PathPtr path)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_00;
  long lVar1;
  PathPtr path_00;
  undefined8 uVar2;
  undefined1 uVar3;
  size_t sVar4;
  char *pcVar5;
  undefined8 extraout_RDX;
  String *pSVar6;
  StringPtr name;
  StringPtr name_00;
  Path newPath;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_68 [32];
  Maybe<kj::_::Mutex::Waiter_&> local_48;
  _Base_ptr p_Stack_40;
  
  sVar4 = path.parts.size_;
  pSVar6 = path.parts.ptr;
  if (sVar4 == 0) {
    uVar3 = 1;
  }
  else if (sVar4 == 1) {
    this_00 = &this->impl;
    local_68[0] = 0;
    _::Mutex::lock(&this_00->mutex,1);
    p_Stack_40 = (_Base_ptr)&(this->impl).value;
    if ((pSVar6->content).size_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pSVar6->content).ptr;
    }
    name.content.size_ = (size_t)pcVar5;
    name.content.ptr = (char *)p_Stack_40;
    local_48.ptr = (Waiter *)this_00;
    Impl::tryGetEntry((Impl *)local_68,name);
    lVar1 = CONCAT71(local_68._1_7_,local_68[0]);
    if (lVar1 == 0) {
      uVar3 = false;
    }
    else {
      uVar3 = true;
      if (*(int *)(lVar1 + 0x18) == 3) {
        SymlinkNode::parse((Path *)local_68,(SymlinkNode *)(lVar1 + 0x20));
        _::Mutex::unlock(&this_00->mutex,SHARED,(Waiter *)0x0);
        local_48.ptr = (Waiter *)0x0;
        p_Stack_40 = (_Base_ptr)0x0;
        path_00.parts.ptr._1_7_ = local_68._1_7_;
        path_00.parts.ptr._0_1_ = local_68[0];
        path_00.parts.size_ = local_68._8_8_;
        uVar3 = exists(this,path_00);
        uVar2 = local_68._8_8_;
        lVar1 = CONCAT71(local_68._1_7_,local_68[0]);
        if (lVar1 != 0) {
          local_68[0] = 0;
          local_68._1_7_ = 0;
          local_68._8_8_ = (_func_int **)0x0;
          (***(_func_int ***)local_68._16_8_)
                    (local_68._16_8_,lVar1,0x18,uVar2,uVar2,
                     ArrayDisposer::Dispose_<kj::String>::destruct);
        }
      }
    }
    if (local_48.ptr != (Waiter *)0x0) {
      _::Mutex::unlock((Mutex *)local_48.ptr,SHARED,(Waiter *)0x0);
    }
  }
  else {
    if ((pSVar6->content).size_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pSVar6->content).ptr;
    }
    name_00.content.size_ = (size_t)pcVar5;
    name_00.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)local_68,name_00);
    if ((_func_int **)local_68._8_8_ == (_func_int **)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*(_func_int **)local_68._8_8_ + 0x40))
                        (local_68._8_8_,pSVar6 + 1,sVar4 - 1);
      (*(code *)**(undefined8 **)CONCAT71(local_68._1_7_,local_68[0]))
                ((undefined8 *)CONCAT71(local_68._1_7_,local_68[0]),
                 local_68._8_8_ + *(long *)(*(_func_int **)local_68._8_8_ + -0x10),extraout_RDX);
    }
  }
  return (bool)uVar3;
}

Assistant:

bool exists(PathPtr path) const override {
    if (path.size() == 0) {
      return true;
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return exists(lock, entry);
      } else {
        return false;
      }
    } else {
      KJ_IF_SOME(subdir, tryGetParent(path[0])) {
        return subdir->exists(path.slice(1, path.size()));
      } else {
        return false;
      }
    }
  }